

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *o,Literal *literal)

{
  Type *this;
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  int32_t iVar4;
  ostream *poVar5;
  int64_t iVar6;
  char *in_RCX;
  char *pcVar7;
  Literal *other;
  value_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  long lVar9;
  float f;
  double d;
  Name NVar10;
  Iterator IVar11;
  Name name;
  SmallVector<wasm::Literal,_1UL> local_b0;
  undefined1 local_78 [8];
  shared_ptr<wasm::GCData> data;
  undefined1 local_50 [8];
  value_type c;
  HeapType heapType;
  
  Colors::orange(o);
  this = &literal->type;
  bVar1 = Type::isSingle(this);
  if (!bVar1) {
    __assert_fail("literal.type.isSingle()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x221,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  poVar5 = o;
  if (this->id < 7) {
    BVar2 = Type::getBasic(this);
    switch(BVar2) {
    case none:
      pcVar7 = "?";
      goto LAB_009c9f97;
    case unreachable:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x238);
    case i32:
      iVar4 = Literal::geti32(literal);
      std::ostream::operator<<(o,iVar4);
      break;
    case i64:
      Literal::geti64(literal);
      std::ostream::_M_insert<long>((long)o);
      break;
    case f32:
      f = Literal::getf32(literal);
      Literal::printFloat(o,f);
      break;
    case f64:
      d = Literal::getf64(literal);
      Literal::printDouble(o,d);
      break;
    case v128:
      std::operator<<(o,"i32x4 ");
      _local_50 = (Name)Literal::getv128(literal);
      Literal::printVec128(o,(array<unsigned_char,_16UL> *)local_50);
    }
    goto switchD_009c9ceb_default;
  }
  bVar1 = Type::isRef(this);
  if (!bVar1) {
    __assert_fail("literal.type.isRef()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x23b,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
  }
  c.type.id = (uintptr_t)Type::getHeapType(this);
  if (c.type.id < 0xe) {
    BVar3 = HeapType::getBasic((HeapType *)&c.type);
    switch(BVar3) {
    case ext:
      pcVar7 = "externref";
      break;
    case func:
    case any:
    case eq:
    case struct_:
    case array:
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x253);
    case i31:
      poVar5 = std::operator<<(o,"i31ref(");
      iVar4 = Literal::geti31(literal,true);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      goto LAB_009c9ed1;
    case string:
      Literal::getGCData((Literal *)local_78);
      if (local_78 == (undefined1  [8])0x0) {
        pcVar7 = "nullstring";
      }
      else {
        std::operator<<(o,"string(\"");
        IVar11 = SmallVector<wasm::Literal,_1UL>::end
                           ((SmallVector<wasm::Literal,_1UL> *)((long)local_78 + 8));
        data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             IVar11.
             super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
             .index;
        lVar9 = -0x18;
        for (p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            p_Var8 || (SmallVector<wasm::Literal,_1UL> *)((long)local_78 + 8) !=
                      IVar11.
                      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      .parent;
            p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&p_Var8->_vptr__Sp_counted_base + 1)) {
          other = (Literal *)
                  ((long)&((((Literals *)((long)local_78 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start)->field_0 + lVar9);
          if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            other = (((Literals *)((long)local_78 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    fixed._M_elems;
          }
          Literal::Literal((Literal *)local_50,other);
          iVar6 = Literal::getInteger((Literal *)local_50);
          std::operator<<(o,(char)iVar6);
          Literal::~Literal((Literal *)local_50);
          lVar9 = lVar9 + 0x18;
        }
        pcVar7 = "\")";
      }
      std::operator<<(o,pcVar7);
      this_00 = (value_type *)&data;
LAB_009c9fba:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      goto switchD_009c9ceb_default;
    case stringview_wtf8:
    case stringview_wtf16:
    case stringview_iter:
      handle_unreachable("TODO: string literals",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x265);
    case none:
      pcVar7 = "nullref";
      break;
    case noext:
      pcVar7 = "nullexternref";
      break;
    case nofunc:
      pcVar7 = "nullfuncref";
      break;
    default:
      goto switchD_009c9ceb_default;
    }
  }
  else {
    bVar1 = HeapType::isSignature((HeapType *)&c.type);
    if (!bVar1) {
      bVar1 = Type::isData(this);
      if (!bVar1) {
        __assert_fail("literal.isData()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                      ,0x26a,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
      }
      Literal::getGCData((Literal *)local_50);
      if (local_50 == (undefined1  [8])0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                      ,0x26c,"std::ostream &wasm::operator<<(std::ostream &, Literal)");
      }
      poVar5 = std::operator<<(o,"[ref ");
      poVar5 = operator<<(poVar5,(HeapType)((HeapType *)local_50)->id);
      poVar5 = std::operator<<(poVar5,' ');
      SmallVector<wasm::Literal,_1UL>::SmallVector
                (&local_b0,(SmallVector<wasm::Literal,_1UL> *)((long)local_50 + 8));
      poVar5 = operator<<(poVar5,(Literals *)&local_b0);
      std::operator<<(poVar5,']');
      SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_b0);
      this_00 = &c;
      goto LAB_009c9fba;
    }
    poVar5 = std::operator<<(o,"funcref(");
    NVar10 = Literal::getFunc(literal);
    name.super_IString.str._M_len = NVar10.super_IString.str._M_str;
    name.super_IString.str._M_str = in_RCX;
    poVar5 = operator<<((wasm *)poVar5,NVar10.super_IString.str._M_len,name);
LAB_009c9ed1:
    pcVar7 = ")";
  }
LAB_009c9f97:
  std::operator<<(poVar5,pcVar7);
switchD_009c9ceb_default:
  Colors::normal(o);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, Literal literal) {
  prepareMinorColor(o);
  assert(literal.type.isSingle());
  if (literal.type.isBasic()) {
    switch (literal.type.getBasic()) {
      case Type::none:
        o << "?";
        break;
      case Type::i32:
        o << literal.geti32();
        break;
      case Type::i64:
        o << literal.geti64();
        break;
      case Type::f32:
        literal.printFloat(o, literal.getf32());
        break;
      case Type::f64:
        literal.printDouble(o, literal.getf64());
        break;
      case Type::v128:
        o << "i32x4 ";
        literal.printVec128(o, literal.getv128());
        break;
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  } else {
    assert(literal.type.isRef());
    auto heapType = literal.type.getHeapType();
    if (heapType.isBasic()) {
      switch (heapType.getBasic()) {
        case HeapType::i31:
          o << "i31ref(" << literal.geti31() << ")";
          break;
        case HeapType::none:
          o << "nullref";
          break;
        case HeapType::noext:
          o << "nullexternref";
          break;
        case HeapType::nofunc:
          o << "nullfuncref";
          break;
        case HeapType::ext:
          o << "externref";
          break;
        case HeapType::any:
        case HeapType::eq:
        case HeapType::func:
        case HeapType::struct_:
        case HeapType::array:
          WASM_UNREACHABLE("invalid type");
        case HeapType::string: {
          auto data = literal.getGCData();
          if (!data) {
            o << "nullstring";
          } else {
            o << "string(\"";
            for (auto c : data->values) {
              // TODO: more than ascii
              o << char(c.getInteger());
            }
            o << "\")";
          }
          break;
        }
        case HeapType::stringview_wtf8:
        case HeapType::stringview_wtf16:
        case HeapType::stringview_iter:
          WASM_UNREACHABLE("TODO: string literals");
      }
    } else if (heapType.isSignature()) {
      o << "funcref(" << literal.getFunc() << ")";
    } else {
      assert(literal.isData());
      auto data = literal.getGCData();
      assert(data);
      o << "[ref " << data->type << ' ' << data->values << ']';
    }
  }
  restoreNormalColor(o);
  return o;
}